

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O3

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::getVertexFaceNeighbor
          (NonIterativeFeaturePreservingMeshFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,VertexHandle vh,double r,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *vertex_face_neighbor)

{
  pointer *ppFVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  iterator __position;
  double dVar6;
  int iVar7;
  value_type vVar8;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  reference pvVar9;
  size_type __n;
  _Bit_type *p_Var10;
  pointer pFVar11;
  BaseHandle BVar12;
  ulong uVar13;
  undefined1 auVar14 [8];
  long lVar15;
  double dVar16;
  double dVar17;
  vector<bool,_std::allocator<bool>_> local_120;
  BaseHandle local_f8;
  FaceHandle fh;
  undefined1 auStack_d8 [8];
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  queue_face_handle;
  undefined1 auStack_58 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  BaseHandle local_34 [2];
  FaceHandle temp_fh;
  
  this_00 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                      ((PropertyContainer *)
                       &(mesh->super_Mesh).
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .field_0x8,
                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                       (mesh->super_Mesh).
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                       super_BaseHandle.idx_);
  pvVar9 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                     (this_00,(int)vh.super_BaseHandle.idx_);
  dVar2 = (pvVar9->super_VectorDataT<double,_3>).values_[0];
  dVar3 = (pvVar9->super_VectorDataT<double,_3>).values_[1];
  dVar4 = (pvVar9->super_VectorDataT<double,_3>).values_[2];
  __n = (**(code **)(*(long *)&(mesh->super_Mesh).
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    + 0x28))(mesh);
  auStack_d8 = (undefined1  [8])((ulong)auStack_d8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_120,__n,(bool *)auStack_d8,(allocator_type *)auStack_58);
  pFVar11 = (vertex_face_neighbor->
            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl
            .super__Vector_impl_data._M_start;
  if ((vertex_face_neighbor->
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar11) {
    (vertex_face_neighbor->
    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
    super__Vector_impl_data._M_finish = pFVar11;
  }
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::_M_initialize_map
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_d8,
             0);
  OpenMesh::Iterators::
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
  ::GenericCirculatorT
            ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              *)auStack_58,(mesh_ref)mesh,(VertexHandle)vh.super_BaseHandle.idx_,false);
  if (face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ != -1) {
    do {
      if (((int)face_neighbor.
                super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Vector_impl_data._M_start ==
           face_neighbor.
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_) &&
         ((int)face_neighbor.
               super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish != 0)) break;
      vVar8 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                           *)auStack_58);
      pVVar5 = (face_centroid->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar6 = dVar2 - pVVar5[(int)vVar8.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_
                      [0];
      dVar16 = dVar3 - pVVar5[(int)vVar8.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_
                       [1];
      dVar17 = dVar4 - pVVar5[(int)vVar8.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_
                       [2];
      if (SQRT(dVar17 * dVar17 + dVar6 * dVar6 + dVar16 * dVar16) <= r + r) {
        local_f8.idx_ =
             (int)OpenMesh::Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                               *)auStack_58);
        if ((_Elt_pointer)
            queue_face_handle.c.
            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Deque_impl_data._M_start._M_node ==
            queue_face_handle.c.
            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first + -1) {
          std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
          _M_push_back_aux<OpenMesh::FaceHandle>
                    ((deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                     auStack_d8,(FaceHandle *)&stack0xffffffffffffff08);
        }
        else {
          *(int *)queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node = local_f8.idx_;
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_start._M_node =
               (_Map_pointer)
               ((long)queue_face_handle.c.
                      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
        }
      }
      vVar8 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                           *)auStack_58);
      BVar12.idx_ = (int)vVar8.super_BaseHandle.idx_ + 0x3f;
      if (-1 < (int)vVar8.super_BaseHandle.idx_) {
        BVar12 = vVar8.super_BaseHandle.idx_;
      }
      local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p
      [(long)(BVar12.idx_ >> 6) +
       ((ulong)(((long)(int)vVar8.super_BaseHandle.idx_ & 0x800000000000003fU) < 0x8000000000000001)
       - 1)] = local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [(long)(BVar12.idx_ >> 6) +
                ((ulong)(((long)(int)vVar8.super_BaseHandle.idx_ & 0x800000000000003fU) <
                        0x8000000000000001) - 1)] | 1L << ((byte)vVar8.super_BaseHandle.idx_ & 0x3f)
      ;
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)&stack0xffffffffffffff08,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)auStack_58,0);
    } while (face_neighbor.
             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
             .super__Vector_impl_data._M_start._4_4_ != -1);
  }
  auStack_58 = (undefined1  [8])0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_map_size) {
    do {
      local_f8.idx_ =
           *(int *)queue_face_handle.c.
                   super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                   _M_impl.super__Deque_impl_data._M_map_size;
      __position._M_current =
           (vertex_face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (vertex_face_neighbor->
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
        _M_realloc_insert<OpenMesh::FaceHandle_const&>
                  ((vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                   vertex_face_neighbor,__position,(FaceHandle *)&stack0xffffffffffffff08);
      }
      else {
        ((__position._M_current)->super_BaseHandle).idx_ = local_f8.idx_;
        ppFVar1 = &(vertex_face_neighbor->
                   super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppFVar1 = *ppFVar1 + 1;
      }
      if ((_Elt_pointer)
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_map_size ==
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_start._M_first + -1) {
        operator_delete(queue_face_handle.c.
                        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_map_size =
             *(size_t *)
              (queue_face_handle.c.
               super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last + 2);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_first =
             (_Elt_pointer)
             (queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_map_size + 0x200);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size;
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_last =
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_start._M_last + 2;
      }
      else {
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_map_size =
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size + 4;
      }
      MeshDenoisingBase::getFaceNeighbor
                (&this->super_MeshDenoisingBase,mesh,(FaceHandle)local_f8.idx_,kVertexBased,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_58);
      auVar14 = auStack_58;
      if (0 < (int)((ulong)((long)face_neighbor.
                                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) >> 2
                   )) {
        lVar15 = 0;
        p_Var10 = local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        pFVar11 = face_neighbor.
                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_34[0].idx_ =
               *(int *)((long)&(((mesh_ptr)auVar14)->super_ArrayKernel).super_BaseKernel.
                               _vptr_BaseKernel + lVar15 * 4);
          uVar13 = (ulong)local_34[0].idx_;
          iVar7 = local_34[0].idx_ + 0x3f;
          if (-1 < (long)uVar13) {
            iVar7 = local_34[0].idx_;
          }
          if ((p_Var10[(long)(iVar7 >> 6) +
                       ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar13 & 0x3f) & 1) == 0) {
            pVVar5 = (face_centroid->
                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            dVar6 = dVar2 - pVVar5[uVar13].super_VectorDataT<double,_3>.values_[0];
            dVar16 = dVar3 - pVVar5[uVar13].super_VectorDataT<double,_3>.values_[1];
            dVar17 = dVar4 - pVVar5[uVar13].super_VectorDataT<double,_3>.values_[2];
            if (SQRT(dVar17 * dVar17 + dVar6 * dVar6 + dVar16 * dVar16) <= r + r) {
              if ((_Elt_pointer)
                  queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node ==
                  queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first + -1) {
                std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
                _M_push_back_aux<OpenMesh::FaceHandle_const&>
                          ((deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                           auStack_d8,(FaceHandle *)local_34);
              }
              else {
                *(int *)queue_face_handle.c.
                        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node = local_34[0].idx_;
                queue_face_handle.c.
                super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node =
                     (_Map_pointer)
                     ((long)queue_face_handle.c.
                            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
              }
            }
            BVar12.idx_ = local_34[0].idx_ + 0x3f;
            if (-1 < (long)local_34[0].idx_) {
              BVar12.idx_ = local_34[0].idx_;
            }
            local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)(BVar12.idx_ >> 6) +
             ((ulong)(((long)local_34[0].idx_ & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
                 local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(BVar12.idx_ >> 6) +
                  ((ulong)(((long)local_34[0].idx_ & 0x800000000000003fU) < 0x8000000000000001) - 1)
                 ] | 1L << ((byte)local_34[0].idx_ & 0x3f);
            p_Var10 = local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            pFVar11 = face_neighbor.
                      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            auVar14 = auStack_58;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (int)((ulong)((long)pFVar11 - (long)auVar14) >> 2));
      }
    } while (queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size);
    if (auVar14 != (undefined1  [8])0x0) {
      operator_delete((void *)auVar14);
    }
  }
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Deque_base
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_d8)
  ;
  if (local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::getVertexFaceNeighbor(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, TriMesh::VertexHandle vh, double r,
                                                                       std::vector<TriMesh::FaceHandle> &vertex_face_neighbor)
{
    double radius = 2.0 * r;
    TriMesh::Point point = mesh.point(vh);

    std::vector<bool> mark(mesh.n_faces(), false);
    vertex_face_neighbor.clear();
    std::queue<TriMesh::FaceHandle> queue_face_handle;
    for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(vh); vf_it.is_valid(); vf_it++)
    {
        TriMesh::Point centroid = face_centroid[(*vf_it).idx()];
        double length = (point - centroid).length();
        if( length <= radius )
            queue_face_handle.push(*vf_it);
        mark[(*vf_it).idx()] = true;
    }

    std::vector<TriMesh::FaceHandle> face_neighbor;

    while(!queue_face_handle.empty())
    {
        TriMesh::FaceHandle fh = queue_face_handle.front();
        vertex_face_neighbor.push_back(fh);
        queue_face_handle.pop();
        getFaceNeighbor(mesh, fh, kVertexBased, face_neighbor);
        for(int i = 0; i < (int)face_neighbor.size(); i++)
        {
            TriMesh::FaceHandle temp_fh = face_neighbor[i];
            if(mark[temp_fh.idx()] == false)
            {
                TriMesh::Point centroid = face_centroid[temp_fh.idx()];
                double length = (point - centroid).length();
                if(length <= radius)
                    queue_face_handle.push(temp_fh);
                mark[temp_fh.idx()] = true;
            }
        }
    }
}